

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_heap.c
# Opt level: O3

void vmcache_heap_remove(heap *heap,extent *ext)

{
  size_t sVar1;
  ptr_ext_t *ppVar2;
  
  sVar1 = ext[-2].size;
  if (sVar1 == 0) {
    ppVar2 = ext[-1].ptr;
  }
  else {
    ppVar2 = ext[-1].ptr;
    *(ptr_ext_t **)(sVar1 - 0x10) = ppVar2;
  }
  if (ppVar2 != (ptr_ext_t *)0x0) {
    *(size_t *)(ppVar2 + -0x18) = sVar1;
  }
  if ((extent *)heap->first_extent == ext) {
    heap->first_extent = (ptr_ext_t *)ext[-2].size;
  }
  heap->entries = heap->entries - 1;
  return;
}

Assistant:

static void
vmcache_heap_remove(struct heap *heap, struct extent *ext)
{
	LOG(3, "heap %p ext %p", heap, ext);

	struct header *header = vmcache_extent_get_header(ext->ptr);

	ASSERT(header->next || header->prev ||
			(heap->first_extent == ext->ptr));

	if (header->next) {
		struct header *header_next =
				vmcache_extent_get_header(header->next);
		ASSERTeq(header_next->prev, ext->ptr);
		header_next->prev = header->prev;
	}

	if (header->prev) {
		struct header *header_prev =
				vmcache_extent_get_header(header->prev);
		ASSERTeq(header_prev->next, ext->ptr);
		header_prev->next = header->next;
	}

	if (heap->first_extent == ext->ptr)
		heap->first_extent = header->next;

#ifdef STATS_ENABLED
	heap->entries--;
#endif
}